

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_noise.c
# Opt level: O0

void fe_lower_envelope(noise_stats_t *noise_stats,powspec_t *buf,powspec_t *floor_buf,int32 num_filt
                      )

{
  int local_28;
  int i;
  int32 num_filt_local;
  powspec_t *floor_buf_local;
  powspec_t *buf_local;
  noise_stats_t *noise_stats_local;
  
  for (local_28 = 0; local_28 < num_filt; local_28 = local_28 + 1) {
    if ((double)buf[local_28] < (double)floor_buf[local_28]) {
      floor_buf[local_28] =
           (powspec_t)
           ((double)noise_stats->lambda_b * (double)floor_buf[local_28] +
           (double)noise_stats->comp_lambda_b * (double)buf[local_28]);
    }
    else {
      floor_buf[local_28] =
           (powspec_t)
           ((double)noise_stats->lambda_a * (double)floor_buf[local_28] +
           (double)noise_stats->comp_lambda_a * (double)buf[local_28]);
    }
  }
  return;
}

Assistant:

static void
fe_lower_envelope(noise_stats_t *noise_stats, powspec_t * buf, powspec_t * floor_buf, int32 num_filt)
{
    int i;

    for (i = 0; i < num_filt; i++) {
#ifndef FIXED_POINT
        if (buf[i] >= floor_buf[i]) {
            floor_buf[i] =
                noise_stats->lambda_a * floor_buf[i] + noise_stats->comp_lambda_a * buf[i];
        }
        else {
            floor_buf[i] =
                noise_stats->lambda_b * floor_buf[i] + noise_stats->comp_lambda_b * buf[i];
        }
#else
        if (buf[i] >= floor_buf[i]) {
            floor_buf[i] = fe_log_add(noise_stats->lambda_a + floor_buf[i],
                                  noise_stats->comp_lambda_a + buf[i]);
        }
        else {
            floor_buf[i] = fe_log_add(noise_stats->lambda_b + floor_buf[i],
                                  noise_stats->comp_lambda_b + buf[i]);
        }
#endif
    }
}